

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O0

void __thiscall QStyleOptionViewItem::QStyleOptionViewItem(QStyleOptionViewItem *this,int version)

{
  undefined4 in_ESI;
  long in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  undefined4 in_stack_00000008;
  undefined4 in_stack_fffffffffffffff0;
  
  QStyleOption::QStyleOption
            ((QStyleOption *)CONCAT44(version,in_stack_00000008),unaff_retaddr_00,unaff_retaddr);
  QFlags<Qt::AlignmentFlag>::QFlags
            ((QFlags<Qt::AlignmentFlag> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (AlignmentFlag)((ulong)in_RDI >> 0x20));
  QFlags<Qt::AlignmentFlag>::QFlags
            ((QFlags<Qt::AlignmentFlag> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (AlignmentFlag)((ulong)in_RDI >> 0x20));
  *(undefined4 *)(in_RDI + 0x48) = 2;
  *(undefined4 *)(in_RDI + 0x4c) = 0;
  QSize::QSize((QSize *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  QFont::QFont((QFont *)(in_RDI + 0x58));
  *(undefined1 *)(in_RDI + 0x68) = 0;
  QFlags<QStyleOptionViewItem::ViewItemFeature>::QFlags
            ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffff0),(ViewItemFeature)((ulong)in_RDI >> 0x20));
  QLocale::QLocale((QLocale *)(in_RDI + 0x70));
  *(undefined8 *)(in_RDI + 0x78) = 0;
  QModelIndex::QModelIndex((QModelIndex *)0x41d87c);
  *(undefined4 *)(in_RDI + 0x98) = 0;
  QIcon::QIcon((QIcon *)(in_RDI + 0xa0));
  QString::QString((QString *)0x41d8a6);
  *(undefined4 *)(in_RDI + 0xc0) = 0;
  QBrush::QBrush((QBrush *)(in_RDI + 200));
  return;
}

Assistant:

QStyleOptionViewItem::QStyleOptionViewItem(int version)
    : QStyleOption(version, SO_ViewItem),
      displayAlignment(Qt::AlignLeft), decorationAlignment(Qt::AlignLeft),
      textElideMode(Qt::ElideMiddle), decorationPosition(Left),
      showDecorationSelected(false), features(None), widget(nullptr),
      checkState(Qt::Unchecked), viewItemPosition(QStyleOptionViewItem::Invalid)
{
}